

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

int Abc_NtkSpeedupNode_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsCi(pNode);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                      ,0x163,"int Abc_NtkSpeedupNode_rec(Abc_Obj_t *, Vec_Ptr_t *)");
      }
      Abc_NodeSetTravIdCurrent(pNode);
      pAVar2 = Abc_ObjFanin0(pNode);
      iVar1 = Abc_NtkSpeedupNode_rec(pAVar2,vNodes);
      if (iVar1 == 0) {
        pNode_local._4_4_ = 0;
      }
      else {
        pAVar2 = Abc_ObjFanin1(pNode);
        iVar1 = Abc_NtkSpeedupNode_rec(pAVar2,vNodes);
        if (iVar1 == 0) {
          pNode_local._4_4_ = 0;
        }
        else {
          Vec_PtrPush(vNodes,pNode);
          pNode_local._4_4_ = 1;
        }
      }
    }
    else {
      pNode_local._4_4_ = 0;
    }
  }
  else {
    pNode_local._4_4_ = 1;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkSpeedupNode_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return 1;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    Abc_NodeSetTravIdCurrent( pNode );
    if ( !Abc_NtkSpeedupNode_rec( Abc_ObjFanin0(pNode), vNodes ) )
        return 0;
    if ( !Abc_NtkSpeedupNode_rec( Abc_ObjFanin1(pNode), vNodes ) )
        return 0;
    Vec_PtrPush( vNodes, pNode );
    return 1;
}